

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O3

void __thiscall Tle::ExtractDouble(Tle *this,string *str,int point_pos,double *val)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  runtime_error *prVar4;
  char *pcVar5;
  char cVar6;
  undefined1 local_60 [8];
  string temp;
  
  local_60 = (undefined1  [8])&temp._M_string_length;
  temp._M_dataplus._M_p = (pointer)0x0;
  temp._M_string_length._0_1_ = 0;
  temp.field_2._8_8_ = val;
  if (str->_M_string_length != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    bVar2 = false;
    pcVar5 = pcVar3;
    do {
      cVar6 = (char)local_60;
      if (point_pos < 0) {
        if (pcVar5 == pcVar3 && point_pos == -1) {
          std::__cxx11::string::push_back(cVar6);
          std::__cxx11::string::push_back(cVar6);
        }
LAB_001141d6:
        if (9 < (int)*pcVar5 - 0x30U) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"Invalid digit");
LAB_001142b6:
          *(undefined ***)prVar4 = &PTR__runtime_error_0011acf0;
          __cxa_throw(prVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
        }
LAB_001141e7:
        std::__cxx11::string::push_back(cVar6);
      }
      else {
        if (pcVar3 + ((ulong)(uint)point_pos - 1) <= pcVar5) {
          if (pcVar5 != pcVar3 + ((ulong)(uint)point_pos - 1)) goto LAB_001141d6;
          if (temp._M_dataplus._M_p == (pointer)0x0) {
            std::__cxx11::string::push_back(cVar6);
          }
          if (*pcVar5 != '.') {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Failed to find decimal point");
            goto LAB_001142b6;
          }
          goto LAB_001141e7;
        }
        cVar1 = *pcVar5;
        if ((pcVar5 == pcVar3) && ((cVar1 == '-' || (cVar1 == '+')))) {
          std::__cxx11::string::push_back(cVar6);
        }
        else if ((int)cVar1 - 0x30U < 10) {
          bVar2 = true;
          std::__cxx11::string::push_back(cVar6);
        }
        else {
          if (bVar2) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Unexpected non digit");
LAB_0011432e:
            *(undefined ***)prVar4 = &PTR__runtime_error_0011acf0;
            __cxa_throw(prVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
          }
          if (cVar1 != ' ') {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Invalid character");
            goto LAB_0011432e;
          }
          bVar2 = false;
        }
      }
      pcVar5 = pcVar5 + 1;
      pcVar3 = (str->_M_dataplus)._M_p;
    } while (pcVar5 != pcVar3 + str->_M_string_length);
  }
  bVar2 = Util::FromString<double>((string *)local_60,(double *)temp.field_2._8_8_);
  if (!bVar2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Failed to convert value to double");
    *(undefined ***)prVar4 = &PTR__runtime_error_0011acf0;
    __cxa_throw(prVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_60 != (undefined1  [8])&temp._M_string_length) {
    operator_delete((void *)local_60);
  }
  return;
}

Assistant:

void Tle::ExtractDouble(const std::string& str, int point_pos, double& val)
{
    std::string temp;
    bool found_digit = false;

    for (std::string::const_iterator i = str.begin(); i != str.end(); ++i)
    {
        /*
         * integer part
         */
        if (point_pos >= 0 && i < str.begin() + point_pos - 1)
        {
            bool done = false;

            if (i == str.begin())
            {
                if(*i == '-' || *i == '+')
                {
                    /*
                     * first character could be signed
                     */
                    temp += *i;
                    done = true;
                }
            }

            if (!done)
            {
                if (isdigit(*i))
                {
                    found_digit = true;
                    temp += *i;
                }
                else if (found_digit)
                {
                    throw TleException("Unexpected non digit");
                }
                else if (*i != ' ')
                {
                    throw TleException("Invalid character");
                }
            }
        }
        /*
         * decimal point
         */
        else if (point_pos >= 0 && i == str.begin() + point_pos - 1)
        {
            if (temp.length() == 0)
            {
                /*
                 * integer part is blank, so add a '0'
                 */
                temp += '0';
            }

            if (*i == '.')
            {
                /*
                 * decimal point found
                 */
                temp += *i;
            }
            else
            {
                throw TleException("Failed to find decimal point");
            }
        }
        /*
         * fraction part
         */
        else
        {
            if (i == str.begin() && point_pos == -1)
            {
                /*
                 * no decimal point expected, add 0. beginning
                 */
                temp += '0';
                temp += '.';
            }
            
            /*
             * should be a digit
             */
            if (isdigit(*i))
            {
                temp += *i;
            }
            else
            {
                throw TleException("Invalid digit");
            }
        }
    }

    if (!Util::FromString<double>(temp, val))
    {
        throw TleException("Failed to convert value to double");
    }
}